

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

bitset_container_t * bitset_container_create(void)

{
  uint uVar1;
  bitset_container_t *__ptr;
  uint64_t *__s;
  
  __ptr = (bitset_container_t *)roaring_malloc(0x10);
  if (__ptr != (bitset_container_t *)0x0) {
    uVar1 = croaring_hardware_support();
    __s = (uint64_t *)roaring_aligned_malloc((ulong)((uVar1 & 2) << 4) + 0x20,0x2000);
    __ptr->words = __s;
    if (__s != (uint64_t *)0x0) {
      memset(__s,0,0x2000);
      __ptr->cardinality = 0;
      return __ptr;
    }
    roaring_free(__ptr);
  }
  return (bitset_container_t *)0x0;
}

Assistant:

bitset_container_t *bitset_container_create(void) {
    bitset_container_t *bitset =
        (bitset_container_t *)roaring_malloc(sizeof(bitset_container_t));

    if (!bitset) {
        return NULL;
    }

    size_t align_size = 32;
#if CROARING_IS_X64
    int support = croaring_hardware_support();
    if (support & ROARING_SUPPORTS_AVX512) {
        // sizeof(__m512i) == 64
        align_size = 64;
    } else {
        // sizeof(__m256i) == 32
        align_size = 32;
    }
#endif
    bitset->words = (uint64_t *)roaring_aligned_malloc(
        align_size, sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    if (!bitset->words) {
        roaring_free(bitset);
        return NULL;
    }
    bitset_container_clear(bitset);
    return bitset;
}